

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O0

undefined8 read_text_file(string *path)

{
  streambuf *psVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  ifstream file;
  stringstream local_3a0 [16];
  ostream local_390 [376];
  undefined1 local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,8);
  std::__cxx11::stringstream::stringstream(local_3a0);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_390,psVar1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::string read_text_file(const std::string& path) {
  std::ifstream file(path);
  std::stringstream ss;
  ss << file.rdbuf();
  return ss.str();
}